

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::GeometryShaderTests::init(GeometryShaderTests *this,EVP_PKEY_CTX *ctx)

{
  size_type *value;
  uint uVar1;
  int iVar2;
  deUint32 primitive;
  Context *pCVar3;
  pointer pPVar4;
  char *pcVar5;
  size_type sVar6;
  _Alloc_hider name_00;
  int legalNdx;
  GeometryShaderInputType GVar7;
  int extraout_EAX;
  TestNode *pTVar8;
  TestNode *pTVar9;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  GeometryProgramLimitCase *pGVar10;
  GeometryProgramQueryCase *pGVar11;
  ImplementationLimitCase *pIVar12;
  TestCase *pTVar13;
  PrimitivesGeneratedQueryCase *pPVar14;
  OutputCountCase *pOVar15;
  VaryingOutputCountCase *pVVar16;
  BuiltinVariableRenderTest *pBVar17;
  GeometryExpanderRenderTest *pGVar18;
  GeometryShaderRenderTest *pGVar19;
  LayeredRenderCase *pLVar20;
  GeometryInvocationCase *pGVar21;
  long lVar22;
  VertexFeedbackCase *pVVar23;
  VertexFeedbackOverflowCase *pVVar24;
  bool bVar25;
  GeometryShaderInputType inputType;
  GLenum primitive_00;
  GeometryShaderInputType inputType_00;
  GLenum primitive_01;
  long lVar26;
  Method method;
  ShaderInstancingMode SVar27;
  ulong uVar28;
  int *piVar29;
  int in_stack_fffffffffffffe38;
  string name;
  string desc;
  string local_168;
  TestNode *local_148;
  undefined8 uStack_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  allocator<char> local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  string local_f0;
  string local_d0;
  TestNode *local_b0;
  TestNode *local_a8;
  TestNode *local_a0;
  string local_98;
  TestNode *local_78;
  undefined8 uStack_70;
  TestNode *local_68;
  TestNode *local_60;
  TestNode *local_58;
  string local_50;
  
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"query",
             "Query tests.");
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic tests.");
  local_148 = pTVar9;
  pTVar9 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar9,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"input",
             "Different input primitives.");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"conversion",
             "Different input and output primitives.");
  local_a8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"emit",
             "Different emit counts.");
  local_b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"varying",
             "Test varyings.");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"layered",
             "Layered rendering.");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"instanced",
             "Instanced rendering.");
  local_a0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Negative tests.");
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "vertex_transform_feedback","Transform feedback.");
  tcu::TestNode::addChild((TestNode *)this,pTVar8);
  tcu::TestNode::addChild((TestNode *)this,local_148);
  local_58 = pTVar9;
  tcu::TestNode::addChild((TestNode *)this,pTVar9);
  local_78 = node;
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,local_a8);
  tcu::TestNode::addChild((TestNode *)this,local_b0);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  tcu::TestNode::addChild((TestNode *)this,local_a0);
  tcu::TestNode::addChild((TestNode *)this,node_02);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryInputComponents",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_input_components",(char *)0x9123,(GLenum)&name,
             (string *)0x40,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryOutputComponents",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_output_components",(char *)0x9124,(GLenum)&name,
             (string *)0x40,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryImageUniforms",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_image_uniforms",(char *)0x90cd,(GLenum)&name,(string *)0x0
             ,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryTextureImageUnits",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_texture_image_units",(char *)0x8c29,(GLenum)&name,
             (string *)0x10,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryOutputVertices",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_output_vertices",(char *)0x8de0,(GLenum)&name,
             (string *)0x100,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryTotalOutputComponents",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_total_output_components",(char *)0x8de1,(GLenum)&name,
             (string *)0x400,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryUniformComponents",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_uniform_components",(char *)0x8ddf,(GLenum)&name,
             (string *)0x400,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryAtomicCounters",(allocator<char> *)&desc);
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_atomic_counters",(char *)0x92d5,(GLenum)&name,
             (string *)0x0,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar10 = (GeometryProgramLimitCase *)operator_new(0xa8);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&name,"MaxGeometryAtomicCounterBuffers",(allocator<char> *)&desc);
  SVar27 = MODE_WITHOUT_INSTANCING;
  anon_unknown_1::GeometryProgramLimitCase::GeometryProgramLimitCase
            (pGVar10,pCVar3,"max_geometry_atomic_counter_buffers",(char *)0x92cf,(GLenum)&name,
             (string *)0x0,in_stack_fffffffffffffe38);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar10);
  std::__cxx11::string::~string((string *)&name);
  pGVar11 = (GeometryProgramQueryCase *)operator_new(0x98);
  anon_unknown_1::GeometryProgramQueryCase::GeometryProgramQueryCase
            (pGVar11,(this->super_TestCaseGroup).m_context,"geometry_linked_vertices_out",
             "GL_GEOMETRY_LINKED_VERTICES_OUT",0x8916);
  (pGVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryProgramQueryCase_00a09588;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize(&pGVar11->m_cases,1);
  pPVar4 = (pGVar11->m_cases).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4->description = "max_vertices = 1";
  pPVar4->header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 1) out;\n"
  ;
  pPVar4->value = 1;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar11);
  pGVar11 = (GeometryProgramQueryCase *)operator_new(0x98);
  anon_unknown_1::GeometryProgramQueryCase::GeometryProgramQueryCase
            (pGVar11,(this->super_TestCaseGroup).m_context,"geometry_linked_input_type",
             "GL_GEOMETRY_LINKED_INPUT_TYPE",0x8917);
  (pGVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryProgramQueryCase_00a09628;
  local_68 = node_02;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize(&pGVar11->m_cases,3);
  pPVar4 = (pGVar11->m_cases).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4->description = "Triangles";
  pPVar4->header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pPVar4->value = 4;
  pPVar4[1].description = "Lines";
  pPVar4[1].header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (lines) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pPVar4[1].value = 1;
  pPVar4[2].description = "Points";
  pPVar4[2].header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (points) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pPVar4[2].value = 0;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar11);
  pGVar11 = (GeometryProgramQueryCase *)operator_new(0x98);
  anon_unknown_1::GeometryProgramQueryCase::GeometryProgramQueryCase
            (pGVar11,(this->super_TestCaseGroup).m_context,"geometry_linked_output_type",
             "GL_GEOMETRY_LINKED_OUTPUT_TYPE",0x8918);
  (pGVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryProgramQueryCase_00a09678;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize(&pGVar11->m_cases,3);
  pPVar4 = (pGVar11->m_cases).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4->description = "Triangle strip";
  pPVar4->header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (triangle_strip, max_vertices = 3) out;\n"
  ;
  pPVar4->value = 5;
  pPVar4[1].description = "Lines";
  pPVar4[1].header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (line_strip, max_vertices = 3) out;\n"
  ;
  pPVar4[1].value = 3;
  pPVar4[2].description = "Points";
  pPVar4[2].header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pPVar4[2].value = 0;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar11);
  pGVar11 = (GeometryProgramQueryCase *)operator_new(0x98);
  anon_unknown_1::GeometryProgramQueryCase::GeometryProgramQueryCase
            (pGVar11,(this->super_TestCaseGroup).m_context,"geometry_shader_invocations",
             "GL_GEOMETRY_SHADER_INVOCATIONS",0x887f);
  (pGVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryProgramQueryCase_00a096c8;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
  ::resize(&pGVar11->m_cases,2);
  pPVar4 = (pGVar11->m_cases).
           super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::GeometryProgramQueryCase::ProgramCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar4->description = "Default value";
  pPVar4->header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pPVar4->value = 1;
  pPVar4[1].description = "Value declared";
  pPVar4[1].header =
       "${GLSL_VERSION_DECL}\n${GLSL_EXT_GEOMETRY_SHADER}layout (triangles, invocations=2) in;\nlayout (points, max_vertices = 3) out;\n"
  ;
  pPVar4[1].value = 2;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar11);
  pIVar12 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"max_geometry_shader_invocations",
             (char *)0x8e5a,0x20,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
  pIVar12 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"max_geometry_uniform_blocks",
             (char *)0x8a2c,0xc,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
  pIVar12 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"max_geometry_shader_storage_blocks",
             (char *)0x90d7,0,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
  pTVar13 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar13,(this->super_TestCaseGroup).m_context,"layer_provoking_vertex",
                     "GL_LAYER_PROVOKING_VERTEX");
  (pTVar13->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a09768;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar13);
  pPVar14 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar14,(this->super_TestCaseGroup).m_context,"primitives_generated_no_geometry",
             "PRIMITIVES_GENERATED query with no geometry shader",TEST_NO_GEOMETRY);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar14);
  pPVar14 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar14,(this->super_TestCaseGroup).m_context,"primitives_generated_no_amplification",
             "PRIMITIVES_GENERATED query with non amplifying geometry shader",TEST_NO_AMPLIFICATION)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar14);
  pPVar14 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar14,(this->super_TestCaseGroup).m_context,"primitives_generated_amplification",
             "PRIMITIVES_GENERATED query with amplifying geometry shader",TEST_AMPLIFICATION);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar14);
  pPVar14 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar14,(this->super_TestCaseGroup).m_context,"primitives_generated_partial_primitives"
             ,"PRIMITIVES_GENERATED query with geometry shader emitting partial primitives",
             TEST_PARTIAL_PRIMITIVES);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar14);
  pPVar14 = (PrimitivesGeneratedQueryCase *)operator_new(0x88);
  anon_unknown_1::PrimitivesGeneratedQueryCase::PrimitivesGeneratedQueryCase
            (pPVar14,(this->super_TestCaseGroup).m_context,"primitives_generated_instanced",
             "PRIMITIVES_GENERATED query with instanced geometry shader",TEST_INSTANCED);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pPVar14);
  pTVar13 = (TestCase *)operator_new(0x78);
  TestCase::TestCase(pTVar13,(this->super_TestCaseGroup).m_context,"primitives_generated",
                     "Query bound PRIMITIVES_GENERATED query");
  (pTVar13->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_00a09808;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pTVar13);
  pIVar12 = (ImplementationLimitCase *)operator_new(0x80);
  anon_unknown_1::ImplementationLimitCase::ImplementationLimitCase
            (pIVar12,(this->super_TestCaseGroup).m_context,"max_framebuffer_layers",(char *)0x9317,
             0x100,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pIVar12);
  pTVar9 = (TestNode *)operator_new(0x78);
  anon_unknown_1::GeometryShaderFeartureTestCase::GeometryShaderFeartureTestCase
            ((GeometryShaderFeartureTestCase *)pTVar9,(this->super_TestCaseGroup).m_context,
             "framebuffer_default_layers",SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00a09858;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  pTVar9 = (TestNode *)operator_new(0x78);
  anon_unknown_1::GeometryShaderFeartureTestCase::GeometryShaderFeartureTestCase
            ((GeometryShaderFeartureTestCase *)pTVar9,(this->super_TestCaseGroup).m_context,
             "framebuffer_attachment_layered",SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00a098f8;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  pTVar9 = (TestNode *)operator_new(0x78);
  anon_unknown_1::GeometryShaderFeartureTestCase::GeometryShaderFeartureTestCase
            ((GeometryShaderFeartureTestCase *)pTVar9,(this->super_TestCaseGroup).m_context,
             "framebuffer_incomplete_layer_targets",SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00a099e0;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  pTVar9 = (TestNode *)operator_new(0x78);
  anon_unknown_1::GeometryShaderFeartureTestCase::GeometryShaderFeartureTestCase
            ((GeometryShaderFeartureTestCase *)pTVar9,(this->super_TestCaseGroup).m_context,
             "referenced_by_geometry_shader",SSBOArrayLengthTests::init::arraysSized + 1);
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00a09a30;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  pTVar9 = (TestNode *)operator_new(0x78);
  anon_unknown_1::GeometryShaderFeartureTestCase::GeometryShaderFeartureTestCase
            ((GeometryShaderFeartureTestCase *)pTVar9,(this->super_TestCaseGroup).m_context,
             "max_combined_geometry_uniform_components","MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS");
  pTVar9->_vptr_TestNode = (_func_int **)&PTR__TestCase_00a09a80;
  tcu::TestNode::addChild(pTVar8,pTVar9);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec((OutputCountPatternSpec *)&name,10)
  ;
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_10","Output 10 vertices",(OutputCountPatternSpec *)&name);
  pTVar8 = local_148;
  tcu::TestNode::addChild(local_148,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec
            ((OutputCountPatternSpec *)&name,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_128","Output 128 vertices",(OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec
            ((OutputCountPatternSpec *)&name,0x100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_256","Output 256 vertices",(OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec((OutputCountPatternSpec *)&name,-1)
  ;
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_max","Output max vertices",(OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec
            ((OutputCountPatternSpec *)&name,10,100);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_10_and_100","Output 10 and 100 vertices in two invocations",
             (OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec
            ((OutputCountPatternSpec *)&name,100,10);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_100_and_10","Output 100 and 10 vertices in two invocations",
             (OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec
            ((OutputCountPatternSpec *)&name,0,0x80);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_0_and_128","Output 0 and 128 vertices in two invocations",
             (OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pOVar15 = (OutputCountCase *)operator_new(0x140);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  anon_unknown_1::OutputCountPatternSpec::OutputCountPatternSpec
            ((OutputCountPatternSpec *)&name,0x80,0);
  anon_unknown_1::OutputCountCase::OutputCountCase
            (pOVar15,pCVar3,"output_128_and_0","Output 128 and 0 vertices in two invocations",
             (OutputCountPatternSpec *)&name);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pOVar15);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&name);
  pVVar16 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar16,(this->super_TestCaseGroup).m_context,"output_vary_by_attribute",(char *)0x0,
             READ_ATTRIBUTE,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar16);
  pVVar16 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar16,(this->super_TestCaseGroup).m_context,"output_vary_by_uniform",(char *)0x1,
             READ_ATTRIBUTE,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar16);
  pVVar16 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar16,(this->super_TestCaseGroup).m_context,"output_vary_by_texture",(char *)0x2,
             READ_ATTRIBUTE,SVar27);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar16);
  pBVar17 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar17,(this->super_TestCaseGroup).m_context,"point_size","test gl_PointSize",
             TEST_POINT_SIZE,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar17);
  pBVar17 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar17,(this->super_TestCaseGroup).m_context,"primitive_id_in","test gl_PrimitiveIDIn"
             ,TEST_PRIMITIVE_ID_IN,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar17);
  pBVar17 = (BuiltinVariableRenderTest *)operator_new(0x128);
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar17,(this->super_TestCaseGroup).m_context,"primitive_id_in_restarted",
             "test gl_PrimitiveIDIn with primitive restart",TEST_PRIMITIVE_ID_IN,6);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar17);
  pBVar17 = (BuiltinVariableRenderTest *)operator_new(0x128);
  uVar28 = 0;
  anon_unknown_1::BuiltinVariableRenderTest::BuiltinVariableRenderTest
            (pBVar17,(this->super_TestCaseGroup).m_context,"primitive_id","test gl_PrimitiveID",
             TEST_PRIMITIVE_ID,0);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pBVar17);
  pTVar8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_primitive","Different input and output primitives.");
  local_148 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_148,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "triangle_strip_adjacency","Different triangle_strip_adjacency vertex counts.");
  for (lVar26 = 0x10; lVar26 != 0x100; lVar26 = lVar26 + 0x18) {
    pGVar18 = (GeometryExpanderRenderTest *)operator_new(0x120);
    pcVar5 = *(char **)((long)&init::layerTargets[3].desc + lVar26);
    uVar1 = *(uint *)((long)&init::inputPrimitives[0].primitiveType + lVar26);
    uVar28 = (ulong)uVar1;
    anon_unknown_1::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar18,(this->super_TestCaseGroup).m_context,pcVar5,pcVar5,
               *(GLenum *)((long)&init::layerTargets[3].name + lVar26),uVar1);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar18);
  }
  local_60 = pTVar8;
  for (local_138._M_dataplus._M_p._0_4_ = 0; pTVar8 = local_58,
      (int)local_138._M_dataplus._M_p < 0xd;
      local_138._M_dataplus._M_p._0_4_ = (int)local_138._M_dataplus._M_p + 1) {
    de::toString<int>(&desc,(int *)&local_138);
    std::operator+(&name,"vertex_count_",&desc);
    std::__cxx11::string::~string((string *)&desc);
    de::toString<int>(&local_168,(int *)&local_138);
    std::operator+(&desc,"Vertex count is ",&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    pGVar18 = (GeometryExpanderRenderTest *)operator_new(0x128);
    iVar2 = (int)local_138._M_dataplus._M_p;
    uVar28 = 5;
    anon_unknown_1::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar18,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p,0xd,5);
    (pGVar18->super_GeometryShaderRenderTest).super_TestCase.super_TestCase.super_TestNode.
    _vptr_TestNode = (_func_int **)&PTR__GeometryShaderRenderTest_00a09f00;
    *(int *)&pGVar18[1].super_GeometryShaderRenderTest.super_TestCase.super_TestCase.super_TestNode.
             _vptr_TestNode = iVar2;
    tcu::TestNode::addChild(local_148,(TestNode *)pGVar18);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
  }
  tcu::TestNode::addChild(local_58,local_60);
  tcu::TestNode::addChild(pTVar8,local_148);
  pTVar8 = local_78;
  for (lVar26 = 0x10; lVar26 != 0xa0; lVar26 = lVar26 + 0x18) {
    pGVar18 = (GeometryExpanderRenderTest *)operator_new(0x120);
    pcVar5 = *(char **)((long)&init::inputPrimitives[9].outputType + lVar26);
    uVar1 = *(uint *)((long)&init::conversionPrimitives[0].primitiveType + lVar26);
    uVar28 = (ulong)uVar1;
    anon_unknown_1::GeometryExpanderRenderTest::GeometryExpanderRenderTest
              (pGVar18,(this->super_TestCaseGroup).m_context,pcVar5,pcVar5,
               *(GLenum *)((long)&init::inputPrimitives[9].name + lVar26),uVar1);
    tcu::TestNode::addChild(pTVar8,(TestNode *)pGVar18);
  }
  piVar29 = &init::emitTests[0].emitCountB;
  pTVar8 = (TestNode *)0x17;
  while (pTVar8 != (TestNode *)0x0) {
    pcVar5 = *(char **)(piVar29 + 3);
    local_148 = (TestNode *)
                ((long)&pTVar8[-1].m_children.
                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,pcVar5,(allocator<char> *)&local_98);
    std::operator+(&local_138,&local_110,"_emit_");
    de::toString<int>(&local_f0,piVar29 + -2);
    std::operator+(&local_168,&local_138,&local_f0);
    std::operator+(&desc,&local_168,"_end_");
    de::toString<int>(&local_d0,piVar29 + -1);
    std::operator+(&name,&desc,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,pcVar5,&local_111);
    std::operator+(&local_f0,&local_d0," output, emit ");
    de::toString<int>(&local_98,piVar29 + -2);
    std::operator+(&local_110,&local_f0,&local_98);
    std::operator+(&local_138,&local_110," vertices, call EndPrimitive ");
    de::toString<int>(&local_50,piVar29 + -1);
    std::operator+(&local_168,&local_138,&local_50);
    std::operator+(&desc,&local_168," times");
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    iVar2 = *piVar29;
    if (iVar2 != 0) {
      de::toString<int>(&local_f0,piVar29);
      std::operator+(&local_110,"_emit_",&local_f0);
      std::operator+(&local_138,&local_110,"_end_");
      de::toString<int>(&local_d0,piVar29 + 1);
      std::operator+(&local_168,&local_138,&local_d0);
      std::__cxx11::string::append((string *)&name);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      de::toString<int>(&local_d0,piVar29);
      std::operator+(&local_f0,", emit ",&local_d0);
      std::operator+(&local_110,&local_f0," vertices, call EndPrimitive ");
      de::toString<int>(&local_98,piVar29 + 1);
      std::operator+(&local_138,&local_110,&local_98);
      std::operator+(&local_168,&local_138," times");
      std::__cxx11::string::append((string *)&desc);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    pGVar19 = (GeometryShaderRenderTest *)operator_new(0x138);
    local_78 = *(TestNode **)(piVar29 + -2);
    uStack_70 = 0;
    uVar1 = ((EmitTestSpec *)(piVar29 + -3))->outputType;
    uVar28 = (ulong)uVar1;
    anon_unknown_1::GeometryShaderRenderTest::GeometryShaderRenderTest
              (pGVar19,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p,0,uVar1,"a_color",0);
    (pGVar19->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__GeometryShaderRenderTest_00a09f70;
    pGVar19[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    pGVar19[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)local_78;
    *(int *)&pGVar19[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = iVar2
    ;
    *(undefined4 *)
     ((long)&pGVar19[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
         0;
    *(uint *)&pGVar19[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length =
         uVar1;
    tcu::TestNode::addChild(local_a8,(TestNode *)pGVar19);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
    piVar29 = piVar29 + 8;
    pTVar8 = local_148;
  }
  for (lVar26 = 0; lVar26 != 0x78; lVar26 = lVar26 + 0x18) {
    pGVar19 = (GeometryShaderRenderTest *)operator_new(0x128);
    local_148 = *(TestNode **)((long)&init::varyingTests[0].vertexOutputs + lVar26);
    uStack_140 = 0;
    uVar28 = 5;
    anon_unknown_1::GeometryShaderRenderTest::GeometryShaderRenderTest
              (pGVar19,(this->super_TestCaseGroup).m_context,
               *(char **)((long)&init::varyingTests[0].name + lVar26),
               *(char **)((long)&init::varyingTests[0].desc + lVar26),4,5,"a_color",0);
    (pGVar19->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__GeometryShaderRenderTest_00a0a060;
    pGVar19[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    pGVar19[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)local_148;
    tcu::TestNode::addChild(local_b0,(TestNode *)pGVar19);
  }
  pTVar8 = (TestNode *)0x0;
  while (pTVar8 != (TestNode *)0x6) {
    pcVar5 = init::tests[(long)pTVar8].testPrefix;
    local_148 = pTVar8;
    for (lVar26 = 0x10; lVar26 != 0x70; lVar26 = lVar26 + 0x18) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&desc,pcVar5,(allocator<char> *)&local_168);
      std::operator+(&name,&desc,*(char **)(&UNK_00a08ee8 + lVar26));
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,init::tests[(long)pTVar8].descPrefix,
                 (allocator<char> *)&local_138);
      std::operator+(&desc,&local_168,*(char **)((long)&init::layerTargets[0].target + lVar26));
      std::__cxx11::string::~string((string *)&local_168);
      pLVar20 = (LayeredRenderCase *)operator_new(0xc0);
      uVar28 = (ulong)init::tests[(long)pTVar8].test;
      anon_unknown_1::LayeredRenderCase::LayeredRenderCase
                (pLVar20,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 desc._M_dataplus._M_p,
                 *(LayeredRenderTargetType *)((long)&PTR_iterate_00a08ee0 + lVar26),
                 init::tests[(long)pTVar8].test);
      tcu::TestNode::addChild(node_00,(TestNode *)pLVar20);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
    }
    pTVar8 = (TestNode *)((long)&local_148->_vptr_TestNode + 1);
  }
  for (lVar26 = 8; lVar26 != 0x58; lVar26 = lVar26 + 0x10) {
    pGVar21 = (GeometryInvocationCase *)operator_new(0x128);
    pCVar3 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"geometry_",(allocator<char> *)&local_d0);
    pcVar5 = *(char **)((long)&init::tests[5].descPrefix + lVar26);
    std::operator+(&desc,&local_168,pcVar5);
    std::operator+(&name,&desc,"_invocations");
    name_00 = name._M_dataplus;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"Geometry shader with ",(allocator<char> *)&local_98);
    std::operator+(&local_110,&local_f0,pcVar5);
    std::operator+(&local_138,&local_110," invocation(s)");
    uVar28 = 0;
    anon_unknown_1::GeometryInvocationCase::GeometryInvocationCase
              (pGVar21,pCVar3,name_00._M_p,
               (char *)CONCAT44(local_138._M_dataplus._M_p._4_4_,(int)local_138._M_dataplus._M_p),
               *(int *)((long)&init::invocationCases[0].name + lVar26),CASE_FIXED_OUTPUT_COUNTS);
    tcu::TestNode::addChild(node_01,(TestNode *)pGVar21);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&name);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&local_168);
  }
  for (lVar26 = 8; lVar26 != 0x58; lVar26 = lVar26 + 0x10) {
    iVar2 = *(int *)((long)&init::invocationCases[0].name + lVar26);
    if (iVar2 != 1) {
      pGVar21 = (GeometryInvocationCase *)operator_new(0x128);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_168,"geometry_output_different_",(allocator<char> *)&local_138);
      std::operator+(&desc,&local_168,*(char **)((long)&init::tests[5].descPrefix + lVar26));
      std::operator+(&name,&desc,"_invocations");
      uVar28 = 1;
      anon_unknown_1::GeometryInvocationCase::GeometryInvocationCase
                (pGVar21,pCVar3,name._M_dataplus._M_p,
                 "Geometry shader invocation(s) with different emit counts",iVar2,
                 CASE_DIFFERENT_OUTPUT_COUNTS);
      tcu::TestNode::addChild(node_01,(TestNode *)pGVar21);
      std::__cxx11::string::~string((string *)&name);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&local_168);
    }
  }
  for (lVar26 = 0x10; lVar26 != 0x70; lVar26 = lVar26 + 0x18) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"invocation_per_layer_",(allocator<char> *)&local_168);
    std::operator+(&name,&desc,*(char **)(&UNK_00a08ee8 + lVar26));
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,
               "Render to multiple layers with multiple invocations, one invocation per layer, target "
               ,(allocator<char> *)&local_138);
    std::operator+(&desc,&local_168,*(char **)((long)&init::layerTargets[0].target + lVar26));
    std::__cxx11::string::~string((string *)&local_168);
    pLVar20 = (LayeredRenderCase *)operator_new(0xc0);
    uVar28 = 4;
    anon_unknown_1::LayeredRenderCase::LayeredRenderCase
              (pLVar20,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p,
               *(LayeredRenderTargetType *)((long)&PTR_iterate_00a08ee0 + lVar26),
               TEST_INVOCATION_PER_LAYER);
    tcu::TestNode::addChild(node_01,(TestNode *)pLVar20);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
  }
  for (lVar26 = 0x10; SVar27 = (ShaderInstancingMode)uVar28, lVar26 != 0x70; lVar26 = lVar26 + 0x18)
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&desc,"multiple_layers_per_invocation_",(allocator<char> *)&local_168);
    std::operator+(&name,&desc,*(char **)(&UNK_00a08ee8 + lVar26));
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,
               "Render to multiple layers with multiple invocations, multiple layers per invocation, target "
               ,(allocator<char> *)&local_138);
    std::operator+(&desc,&local_168,*(char **)((long)&init::layerTargets[0].target + lVar26));
    std::__cxx11::string::~string((string *)&local_168);
    pLVar20 = (LayeredRenderCase *)operator_new(0xc0);
    uVar28 = 5;
    anon_unknown_1::LayeredRenderCase::LayeredRenderCase
              (pLVar20,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
               desc._M_dataplus._M_p,
               *(LayeredRenderTargetType *)((long)&PTR_iterate_00a08ee0 + lVar26),
               TEST_MULTIPLE_LAYERS_PER_INVOCATION);
    tcu::TestNode::addChild(node_01,(TestNode *)pLVar20);
    std::__cxx11::string::~string((string *)&desc);
    std::__cxx11::string::~string((string *)&name);
  }
  pVVar16 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar16,(this->super_TestCaseGroup).m_context,"invocation_output_vary_by_attribute",
             (char *)0x0,READ_UNIFORM,SVar27);
  tcu::TestNode::addChild(node_01,(TestNode *)pVVar16);
  pVVar16 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar16,(this->super_TestCaseGroup).m_context,"invocation_output_vary_by_uniform",
             (char *)0x1,READ_UNIFORM,SVar27);
  tcu::TestNode::addChild(node_01,(TestNode *)pVVar16);
  pVVar16 = (VaryingOutputCountCase *)operator_new(0x130);
  anon_unknown_1::VaryingOutputCountCase::VaryingOutputCountCase
            (pVVar16,(this->super_TestCaseGroup).m_context,"invocation_output_vary_by_texture",
             (char *)0x2,READ_UNIFORM,SVar27);
  tcu::TestNode::addChild(node_01,(TestNode *)pVVar16);
  pTVar8 = (TestNode *)0x0;
  while (pTVar8 != (TestNode *)0x3) {
    piVar29 = init::numDrawInstances + (long)pTVar8;
    pTVar9 = (TestNode *)0x0;
    local_78 = pTVar8;
    while (pTVar9 != (TestNode *)0x8) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"draw_",(allocator<char> *)&local_98);
      de::toString<int>(&local_f0,piVar29);
      std::operator+(&local_138,&local_110,&local_f0);
      std::operator+(&local_168,&local_138,"_instances_geometry_");
      value = &pTVar9[0x122ce].m_name._M_string_length;
      local_148 = pTVar9;
      de::toString<int>(&local_d0,(int *)value);
      std::operator+(&desc,&local_168,&local_d0);
      std::operator+(&name,&desc,"_invocations");
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"Draw ",(allocator<char> *)&local_50);
      de::toString<int>(&local_d0,piVar29);
      std::operator+(&local_110,&local_f0,&local_d0);
      std::operator+(&local_138,&local_110," instances, with ");
      de::toString<int>(&local_98,(int *)value);
      std::operator+(&local_168,&local_138,&local_98);
      std::operator+(&desc,&local_168," geometry shader invocations.");
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      pGVar19 = (GeometryShaderRenderTest *)operator_new(0x128);
      iVar2 = *piVar29;
      sVar6 = *value;
      anon_unknown_1::GeometryShaderRenderTest::GeometryShaderRenderTest
                (pGVar19,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 desc._M_dataplus._M_p,0,5,"a_offset",1);
      (pGVar19->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__GeometryShaderRenderTest_00a0a290;
      *(int *)&pGVar19[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = iVar2;
      *(int *)((long)&pGVar19[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           (int)sVar6;
      pGVar19[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
      tcu::TestNode::addChild(node_01,(TestNode *)pGVar19);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
      pTVar9 = (TestNode *)((long)&local_148->_vptr_TestNode + 4);
    }
    pTVar8 = (TestNode *)((long)&local_78->_vptr_TestNode + 1);
  }
  pTVar8 = (TestNode *)0x0;
  while (pTVar8 != (TestNode *)0x5) {
    primitive = init::inputTypes[(long)pTVar8];
    local_148 = pTVar8;
    for (lVar26 = 0; lVar26 != 0xb; lVar26 = lVar26 + 1) {
      uVar1 = init::primitiveTypes[lVar26];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"type_",(allocator<char> *)&local_d0);
      GVar7 = sglr::rr_util::mapGLGeometryShaderInputType(primitive);
      (anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                (&local_110,(_anonymous_namespace_ *)(ulong)GVar7,inputType);
      std::operator+(&local_168,&local_138,&local_110);
      std::operator+(&desc,&local_168,"_primitive_");
      (anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                (&local_f0,(_anonymous_namespace_ *)(ulong)uVar1,primitive_00);
      std::operator+(&name,&desc,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_110,"Shader input type ",(allocator<char> *)&local_98);
      GVar7 = sglr::rr_util::mapGLGeometryShaderInputType(primitive);
      (anonymous_namespace)::inputTypeToGLString_abi_cxx11_
                (&local_f0,(_anonymous_namespace_ *)(ulong)GVar7,inputType_00);
      std::operator+(&local_138,&local_110,&local_f0);
      std::operator+(&local_168,&local_138,", draw primitive type ");
      (anonymous_namespace)::primitiveTypeToString_abi_cxx11_
                (&local_d0,(_anonymous_namespace_ *)(ulong)uVar1,primitive_01);
      std::operator+(&desc,&local_168,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      bVar25 = false;
      for (lVar22 = 0; lVar22 != 0xb; lVar22 = lVar22 + 1) {
        if (init::legalConversions[lVar22].inputType == primitive) {
          bVar25 = (bool)(bVar25 | init::legalConversions[lVar22].primitiveType == uVar1);
        }
      }
      if (!bVar25) {
        pTVar13 = (TestCase *)operator_new(0x90);
        TestCase::TestCase(pTVar13,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                           desc._M_dataplus._M_p);
        (pTVar13->super_TestCase).super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__NegativeDrawCase_00a0a380;
        pTVar13[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
        pTVar13[1].super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
        *(deUint32 *)&pTVar13[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p = primitive;
        *(uint *)((long)&pTVar13[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4) =
             uVar1;
        tcu::TestNode::addChild(local_a0,(TestNode *)pTVar13);
      }
      std::__cxx11::string::~string((string *)&desc);
      std::__cxx11::string::~string((string *)&name);
    }
    pTVar8 = (TestNode *)((long)&local_148->_vptr_TestNode + 1);
  }
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_line_loop",
             "Capture line loop lines",METHOD_DRAW_ARRAYS,PRIMITIVE_LINE_LOOP);
  pTVar8 = local_68;
  tcu::TestNode::addChild(local_68,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_line_strip",
             "Capture line strip lines",METHOD_DRAW_ARRAYS,PRIMITIVE_LINE_STRIP);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_triangle_strip",
             "Capture triangle strip triangles",METHOD_DRAW_ARRAYS,PRIMITIVE_TRIANGLE_STRIP);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_triangle_fan",
             "Capture triangle fan triangles",METHOD_DRAW_ARRAYS,PRIMITIVE_TRIANGLE_FAN);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_arrays",
             "Capture primitives generated with drawArrays",METHOD_DRAW_ARRAYS,PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_arrays_instanced",
             "Capture primitives generated with drawArraysInstanced",METHOD_DRAW_ARRAYS_INSTANCED,
             PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_arrays_indirect",
             "Capture primitives generated with drawArraysIndirect",METHOD_DRAW_ARRAYS_INDIRECT,
             PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_elements",
             "Capture primitives generated with drawElements",METHOD_DRAW_ELEMENTS,PRIMITIVE_POINTS)
  ;
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_elements_instanced",
             "Capture primitives generated with drawElementsInstanced",
             METHOD_DRAW_ELEMENTS_INSTANCED,PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar23 = (VertexFeedbackCase *)operator_new(0xa8);
  method = 5;
  anon_unknown_1::VertexFeedbackCase::VertexFeedbackCase
            (pVVar23,(this->super_TestCaseGroup).m_context,"capture_vertex_draw_elements_indirect",
             "Capture primitives generated with drawElementsIndirect",METHOD_DRAW_ELEMENTS_INDIRECT,
             PRIMITIVE_POINTS);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar23);
  pVVar24 = (VertexFeedbackOverflowCase *)operator_new(0x98);
  anon_unknown_1::VertexFeedbackOverflowCase::VertexFeedbackOverflowCase
            (pVVar24,(this->super_TestCaseGroup).m_context,
             "capture_vertex_draw_arrays_overflow_single_buffer",(char *)0x0,method);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar24);
  pVVar24 = (VertexFeedbackOverflowCase *)operator_new(0x98);
  anon_unknown_1::VertexFeedbackOverflowCase::VertexFeedbackOverflowCase
            (pVVar24,(this->super_TestCaseGroup).m_context,
             "capture_vertex_draw_elements_overflow_single_buffer",(char *)0x1,method);
  tcu::TestNode::addChild(pTVar8,(TestNode *)pVVar24);
  return extraout_EAX;
}

Assistant:

void GeometryShaderTests::init (void)
{
	struct PrimitiveTestSpec
	{
		deUint32	primitiveType;
		const char* name;
		deUint32	outputType;
	};

	struct EmitTestSpec
	{
		deUint32	outputType;
		int			emitCountA;		//!< primitive A emit count
		int			endCountA;		//!< primitive A end count
		int			emitCountB;		//!<
		int			endCountB;		//!<
		const char* name;
	};

	static const struct LayeredTarget
	{
		LayeredRenderCase::LayeredRenderTargetType	target;
		const char*									name;
		const char*									desc;
	} layerTargets[] =
	{
		{ LayeredRenderCase::TARGET_CUBE,			"cubemap",				"cubemap"						},
		{ LayeredRenderCase::TARGET_3D,				"3d",					"3D texture"					},
		{ LayeredRenderCase::TARGET_2D_ARRAY,		"2d_array",				"2D array texture"				},
		{ LayeredRenderCase::TARGET_2D_MS_ARRAY,	"2d_multisample_array",	"2D multisample array texture"	},
	};

	tcu::TestCaseGroup* const queryGroup				= new tcu::TestCaseGroup(m_testCtx, "query", "Query tests.");
	tcu::TestCaseGroup* const basicGroup				= new tcu::TestCaseGroup(m_testCtx, "basic", "Basic tests.");
	tcu::TestCaseGroup* const inputPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "input", "Different input primitives.");
	tcu::TestCaseGroup* const conversionPrimitiveGroup	= new tcu::TestCaseGroup(m_testCtx, "conversion", "Different input and output primitives.");
	tcu::TestCaseGroup* const emitGroup					= new tcu::TestCaseGroup(m_testCtx, "emit", "Different emit counts.");
	tcu::TestCaseGroup* const varyingGroup				= new tcu::TestCaseGroup(m_testCtx, "varying", "Test varyings.");
	tcu::TestCaseGroup* const layeredGroup				= new tcu::TestCaseGroup(m_testCtx, "layered", "Layered rendering.");
	tcu::TestCaseGroup* const instancedGroup			= new tcu::TestCaseGroup(m_testCtx, "instanced", "Instanced rendering.");
	tcu::TestCaseGroup* const negativeGroup				= new tcu::TestCaseGroup(m_testCtx, "negative", "Negative tests.");
	tcu::TestCaseGroup* const feedbackGroup				= new tcu::TestCaseGroup(m_testCtx, "vertex_transform_feedback", "Transform feedback.");

	this->addChild(queryGroup);
	this->addChild(basicGroup);
	this->addChild(inputPrimitiveGroup);
	this->addChild(conversionPrimitiveGroup);
	this->addChild(emitGroup);
	this->addChild(varyingGroup);
	this->addChild(layeredGroup);
	this->addChild(instancedGroup);
	this->addChild(negativeGroup);
	this->addChild(feedbackGroup);

	// query test
	{
		// limits with a corresponding glsl constant
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_input_components",				"", GL_MAX_GEOMETRY_INPUT_COMPONENTS,				"MaxGeometryInputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_components",				"", GL_MAX_GEOMETRY_OUTPUT_COMPONENTS,				"MaxGeometryOutputComponents",		64));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_image_uniforms",					"", GL_MAX_GEOMETRY_IMAGE_UNIFORMS,					"MaxGeometryImageUniforms",			0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_texture_image_units",			"", GL_MAX_GEOMETRY_TEXTURE_IMAGE_UNITS,			"MaxGeometryTextureImageUnits",		16));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_output_vertices",				"", GL_MAX_GEOMETRY_OUTPUT_VERTICES,				"MaxGeometryOutputVertices",		256));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_total_output_components",		"", GL_MAX_GEOMETRY_TOTAL_OUTPUT_COMPONENTS,		"MaxGeometryTotalOutputComponents",	1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_uniform_components",				"", GL_MAX_GEOMETRY_UNIFORM_COMPONENTS,				"MaxGeometryUniformComponents",		1024));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counters",				"", GL_MAX_GEOMETRY_ATOMIC_COUNTERS,				"MaxGeometryAtomicCounters",		0));
		queryGroup->addChild(new GeometryProgramLimitCase(m_context, "max_geometry_atomic_counter_buffers",			"", GL_MAX_GEOMETRY_ATOMIC_COUNTER_BUFFERS,			"MaxGeometryAtomicCounterBuffers",	0));

		// program queries
		queryGroup->addChild(new GeometryShaderVerticesQueryCase	(m_context, "geometry_linked_vertices_out",	"GL_GEOMETRY_LINKED_VERTICES_OUT"));
		queryGroup->addChild(new GeometryShaderInputQueryCase		(m_context, "geometry_linked_input_type",	"GL_GEOMETRY_LINKED_INPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderOutputQueryCase		(m_context, "geometry_linked_output_type",	"GL_GEOMETRY_LINKED_OUTPUT_TYPE"));
		queryGroup->addChild(new GeometryShaderInvocationsQueryCase	(m_context, "geometry_shader_invocations",	"GL_GEOMETRY_SHADER_INVOCATIONS"));

		// limits
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_invocations",		"", GL_MAX_GEOMETRY_SHADER_INVOCATIONS,		32));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_uniform_blocks",			"", GL_MAX_GEOMETRY_UNIFORM_BLOCKS,			12));
		queryGroup->addChild(new ImplementationLimitCase(m_context, "max_geometry_shader_storage_blocks",	"", GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS,	0));

		// layer_provoking_vertex_ext
		queryGroup->addChild(new LayerProvokingVertexQueryCase(m_context, "layer_provoking_vertex", "GL_LAYER_PROVOKING_VERTEX"));

		// primitives_generated
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_geometry",		"PRIMITIVES_GENERATED query with no geometry shader",								PrimitivesGeneratedQueryCase::TEST_NO_GEOMETRY));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_no_amplification",	"PRIMITIVES_GENERATED query with non amplifying geometry shader",					PrimitivesGeneratedQueryCase::TEST_NO_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_amplification",		"PRIMITIVES_GENERATED query with amplifying geometry shader",						PrimitivesGeneratedQueryCase::TEST_AMPLIFICATION));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_partial_primitives", "PRIMITIVES_GENERATED query with geometry shader emitting partial primitives",		PrimitivesGeneratedQueryCase::TEST_PARTIAL_PRIMITIVES));
		queryGroup->addChild(new PrimitivesGeneratedQueryCase(m_context, "primitives_generated_instanced",			"PRIMITIVES_GENERATED query with instanced geometry shader",						PrimitivesGeneratedQueryCase::TEST_INSTANCED));

		queryGroup->addChild(new PrimitivesGeneratedQueryObjectQueryCase(m_context, "primitives_generated", "Query bound PRIMITIVES_GENERATED query"));

		// fbo
		queryGroup->addChild(new ImplementationLimitCase				(m_context, "max_framebuffer_layers",				"", GL_MAX_FRAMEBUFFER_LAYERS,	256));
		queryGroup->addChild(new FramebufferDefaultLayersCase			(m_context, "framebuffer_default_layers",			""));
		queryGroup->addChild(new FramebufferAttachmentLayeredCase		(m_context, "framebuffer_attachment_layered",		""));
		queryGroup->addChild(new FramebufferIncompleteLayereTargetsCase	(m_context, "framebuffer_incomplete_layer_targets",	""));

		// resource query
		queryGroup->addChild(new ReferencedByGeometryShaderCase			(m_context, "referenced_by_geometry_shader",	""));

		// combined limits
		queryGroup->addChild(new CombinedGeometryUniformLimitCase		(m_context, "max_combined_geometry_uniform_components", "MAX_COMBINED_GEOMETRY_UNIFORM_COMPONENTS"));
	}

	// basic tests
	{
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10",				"Output 10 vertices",								OutputCountPatternSpec(10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128",				"Output 128 vertices",								OutputCountPatternSpec(128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_256",				"Output 256 vertices",								OutputCountPatternSpec(256)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_max",				"Output max vertices",								OutputCountPatternSpec(-1)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_10_and_100",		"Output 10 and 100 vertices in two invocations",	OutputCountPatternSpec(10, 100)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_100_and_10",		"Output 100 and 10 vertices in two invocations",	OutputCountPatternSpec(100, 10)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_0_and_128",			"Output 0 and 128 vertices in two invocations",		OutputCountPatternSpec(0, 128)));
		basicGroup->addChild(new OutputCountCase			(m_context,	"output_128_and_0",			"Output 128 and 0 vertices in two invocations",		OutputCountPatternSpec(128, 0)));

		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_attribute",	"Output varying number of vertices",				VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_uniform",	"Output varying number of vertices",				VaryingOutputCountShader::READ_UNIFORM,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));
		basicGroup->addChild(new VaryingOutputCountCase		(m_context,	"output_vary_by_texture",	"Output varying number of vertices",				VaryingOutputCountShader::READ_TEXTURE,		VaryingOutputCountCase::MODE_WITHOUT_INSTANCING));

		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"point_size",				"test gl_PointSize",								BuiltinVariableShader::TEST_POINT_SIZE));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in",			"test gl_PrimitiveIDIn",							BuiltinVariableShader::TEST_PRIMITIVE_ID_IN));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id_in_restarted","test gl_PrimitiveIDIn with primitive restart",		BuiltinVariableShader::TEST_PRIMITIVE_ID_IN, GeometryShaderRenderTest::FLAG_USE_RESTART_INDEX | GeometryShaderRenderTest::FLAG_USE_INDICES));
		basicGroup->addChild(new BuiltinVariableRenderTest	(m_context,	"primitive_id",				"test gl_PrimitiveID",								BuiltinVariableShader::TEST_PRIMITIVE_ID));
	}

	// input primitives
	{
		static const PrimitiveTestSpec inputPrimitives[] =
		{
			{ GL_POINTS,					"points",					GL_POINTS			},
			{ GL_LINES,						"lines",					GL_LINE_STRIP		},
			{ GL_LINE_LOOP,					"line_loop",				GL_LINE_STRIP		},
			{ GL_LINE_STRIP,				"line_strip",				GL_LINE_STRIP		},
			{ GL_TRIANGLES,					"triangles",				GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_STRIP,			"triangle_strip",			GL_TRIANGLE_STRIP	},
			{ GL_TRIANGLE_FAN,				"triangle_fan",				GL_TRIANGLE_STRIP	},
			{ GL_LINES_ADJACENCY,			"lines_adjacency",			GL_LINE_STRIP		},
			{ GL_LINE_STRIP_ADJACENCY,		"line_strip_adjacency",		GL_LINE_STRIP		},
			{ GL_TRIANGLES_ADJACENCY,		"triangles_adjacency",		GL_TRIANGLE_STRIP	}
		};

		tcu::TestCaseGroup* const basicPrimitiveGroup		= new tcu::TestCaseGroup(m_testCtx, "basic_primitive",			"Different input and output primitives.");
		tcu::TestCaseGroup* const triStripAdjacencyGroup	= new tcu::TestCaseGroup(m_testCtx, "triangle_strip_adjacency",	"Different triangle_strip_adjacency vertex counts.");

		// more basic types
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(inputPrimitives); ++ndx)
			basicPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, inputPrimitives[ndx].name, inputPrimitives[ndx].name, inputPrimitives[ndx].primitiveType, inputPrimitives[ndx].outputType));

		// triangle strip adjacency with different vtx counts
		for (int vtxCount = 0; vtxCount <= 12; ++vtxCount)
		{
			const std::string name = "vertex_count_" + de::toString(vtxCount);
			const std::string desc = "Vertex count is " + de::toString(vtxCount);

			triStripAdjacencyGroup->addChild(new TriangleStripAdjacencyVertexCountTest(m_context, name.c_str(), desc.c_str(), vtxCount));
		}

		inputPrimitiveGroup->addChild(basicPrimitiveGroup);
		inputPrimitiveGroup->addChild(triStripAdjacencyGroup);
	}

	// different type conversions
	{
		static const PrimitiveTestSpec conversionPrimitives[] =
		{
			{ GL_TRIANGLES,		"triangles_to_points",	GL_POINTS			},
			{ GL_LINES,			"lines_to_points",		GL_POINTS			},
			{ GL_POINTS,		"points_to_lines",		GL_LINE_STRIP		},
			{ GL_TRIANGLES,		"triangles_to_lines",	GL_LINE_STRIP		},
			{ GL_POINTS,		"points_to_triangles",	GL_TRIANGLE_STRIP	},
			{ GL_LINES,			"lines_to_triangles",	GL_TRIANGLE_STRIP	}
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(conversionPrimitives); ++ndx)
			conversionPrimitiveGroup->addChild(new GeometryExpanderRenderTest(m_context, conversionPrimitives[ndx].name, conversionPrimitives[ndx].name, conversionPrimitives[ndx].primitiveType, conversionPrimitives[ndx].outputType));
	}

	// emit different amounts
	{
		static const EmitTestSpec emitTests[] =
		{
			{ GL_POINTS,			 0,		0,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		1,	0,	0,	"points"			},
			{ GL_POINTS,			 0,		2,	0,	0,	"points"			},
			{ GL_POINTS,			 1,		2,	0,	0,	"points"			},
			{ GL_LINE_STRIP,		 0,		0,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		1,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 0,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 1,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	0,	0,	"line_strip"		},
			{ GL_LINE_STRIP,		 2,		2,	2,	0,	"line_strip"		},
			{ GL_TRIANGLE_STRIP,	 0,		0,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		1,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 0,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 1,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 2,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	0,	0,	"triangle_strip"	},
			{ GL_TRIANGLE_STRIP,	 3,		2,	3,	0,	"triangle_strip"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(emitTests); ++ndx)
		{
			std::string name = std::string(emitTests[ndx].name) + "_emit_" + de::toString(emitTests[ndx].emitCountA) + "_end_" + de::toString(emitTests[ndx].endCountA);
			std::string desc = std::string(emitTests[ndx].name) + " output, emit " + de::toString(emitTests[ndx].emitCountA) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountA) + " times";

			if (emitTests[ndx].emitCountB)
			{
				name += "_emit_" + de::toString(emitTests[ndx].emitCountB) + "_end_" + de::toString(emitTests[ndx].endCountB);
				desc += ", emit " + de::toString(emitTests[ndx].emitCountB) + " vertices, call EndPrimitive " + de::toString(emitTests[ndx].endCountB) + " times";
			}

			emitGroup->addChild(new EmitTest(m_context, name.c_str(), desc.c_str(), emitTests[ndx].emitCountA, emitTests[ndx].endCountA, emitTests[ndx].emitCountB, emitTests[ndx].endCountB, emitTests[ndx].outputType));
		}
	}

	// varying
	{
		struct VaryingTestSpec
		{
			int			vertexOutputs;
			int			geometryOutputs;
			const char*	name;
			const char*	desc;
		};

		static const VaryingTestSpec varyingTests[] =
		{
			{ -1, 1, "vertex_no_op_geometry_out_1", "vertex_no_op_geometry_out_1" },
			{  0, 1, "vertex_out_0_geometry_out_1", "vertex_out_0_geometry_out_1" },
			{  0, 2, "vertex_out_0_geometry_out_2", "vertex_out_0_geometry_out_2" },
			{  1, 0, "vertex_out_1_geometry_out_0", "vertex_out_1_geometry_out_0" },
			{  1, 2, "vertex_out_1_geometry_out_2", "vertex_out_1_geometry_out_2" },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(varyingTests); ++ndx)
			varyingGroup->addChild(new VaryingTest(m_context, varyingTests[ndx].name, varyingTests[ndx].desc, varyingTests[ndx].vertexOutputs, varyingTests[ndx].geometryOutputs));
	}

	// layered
	{
		static const struct TestType
		{
			LayeredRenderCase::TestType	test;
			const char*					testPrefix;
			const char*					descPrefix;
		} tests[] =
		{
			{ LayeredRenderCase::TEST_DEFAULT_LAYER,			"render_with_default_layer_",	"Render to all layers of "					},
			{ LayeredRenderCase::TEST_SINGLE_LAYER,				"render_to_one_",				"Render to one layer of "					},
			{ LayeredRenderCase::TEST_ALL_LAYERS,				"render_to_all_",				"Render to all layers of "					},
			{ LayeredRenderCase::TEST_DIFFERENT_LAYERS,			"render_different_to_",			"Render different data to different layers"	},
			{ LayeredRenderCase::TEST_LAYER_ID,					"fragment_layer_",				"Read gl_Layer in fragment shader"			},
			{ LayeredRenderCase::TEST_LAYER_PROVOKING_VERTEX,	"layer_provoking_vertex_",		"Verify LAYER_PROVOKING_VERTEX"				},
		};

		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string(tests[testNdx].testPrefix) + layerTargets[targetNdx].name;
			const std::string desc = std::string(tests[testNdx].descPrefix) + layerTargets[targetNdx].desc;

			layeredGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, tests[testNdx].test));
		}
	}

	// instanced
	{
		static const struct InvocationCase
		{
			const char* name;
			int			numInvocations;
		} invocationCases[] =
		{
			{ "1",		1  },
			{ "2",		2  },
			{ "8",		8  },
			{ "32",		32 },
			{ "max",	-1 },
		};
		static const int numDrawInstances[] = { 2, 4, 8 };
		static const int numDrawInvocations[] = { 2, 8 };

		// same amount of content to all invocations
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			instancedGroup->addChild(new GeometryInvocationCase(m_context,
																(std::string("geometry_") + invocationCases[ndx].name + "_invocations").c_str(),
																(std::string("Geometry shader with ") + invocationCases[ndx].name + " invocation(s)").c_str(),
																invocationCases[ndx].numInvocations,
																GeometryInvocationCase::CASE_FIXED_OUTPUT_COUNTS));

		// different amount of content to each invocation
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(invocationCases); ++ndx)
			if (invocationCases[ndx].numInvocations != 1)
				instancedGroup->addChild(new GeometryInvocationCase(m_context,
																	(std::string("geometry_output_different_") + invocationCases[ndx].name + "_invocations").c_str(),
																	"Geometry shader invocation(s) with different emit counts",
																	invocationCases[ndx].numInvocations,
																	GeometryInvocationCase::CASE_DIFFERENT_OUTPUT_COUNTS));

		// invocation per layer
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("invocation_per_layer_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, one invocation per layer, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_INVOCATION_PER_LAYER));
		}

		// multiple layers per invocation
		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(layerTargets); ++targetNdx)
		{
			const std::string name = std::string("multiple_layers_per_invocation_") + layerTargets[targetNdx].name;
			const std::string desc = std::string("Render to multiple layers with multiple invocations, multiple layers per invocation, target ") + layerTargets[targetNdx].desc;

			instancedGroup->addChild(new LayeredRenderCase(m_context, name.c_str(), desc.c_str(), layerTargets[targetNdx].target, LayeredRenderCase::TEST_MULTIPLE_LAYERS_PER_INVOCATION));
		}

		// different invocation output counts depending on {uniform, attrib, texture}
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_attribute",	"Output varying number of vertices", VaryingOutputCountShader::READ_ATTRIBUTE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_uniform",	"Output varying number of vertices", VaryingOutputCountShader::READ_UNIFORM,	VaryingOutputCountCase::MODE_WITH_INSTANCING));
		instancedGroup->addChild(new VaryingOutputCountCase(m_context,	"invocation_output_vary_by_texture",	"Output varying number of vertices", VaryingOutputCountShader::READ_TEXTURE,	VaryingOutputCountCase::MODE_WITH_INSTANCING));

		// with drawInstanced
		for (int instanceNdx = 0; instanceNdx < DE_LENGTH_OF_ARRAY(numDrawInstances); ++instanceNdx)
		for (int invocationNdx = 0; invocationNdx < DE_LENGTH_OF_ARRAY(numDrawInvocations); ++invocationNdx)
		{
			const std::string name = std::string("draw_") + de::toString(numDrawInstances[instanceNdx]) + "_instances_geometry_" + de::toString(numDrawInvocations[invocationNdx]) + "_invocations";
			const std::string desc = std::string("Draw ") + de::toString(numDrawInstances[instanceNdx]) + " instances, with " + de::toString(numDrawInvocations[invocationNdx]) + " geometry shader invocations.";

			instancedGroup->addChild(new DrawInstancedGeometryInstancedCase(m_context, name.c_str(), desc.c_str(), numDrawInstances[instanceNdx], numDrawInvocations[invocationNdx]));
		}
	}

	// negative (wrong types)
	{
		struct PrimitiveToInputTypeConversion
		{
			GLenum inputType;
			GLenum primitiveType;
		};

		static const PrimitiveToInputTypeConversion legalConversions[] =
		{
			{ GL_POINTS,				GL_POINTS					},
			{ GL_LINES,					GL_LINES					},
			{ GL_LINES,					GL_LINE_LOOP				},
			{ GL_LINES,					GL_LINE_STRIP				},
			{ GL_LINES_ADJACENCY,		GL_LINES_ADJACENCY			},
			{ GL_LINES_ADJACENCY,		GL_LINE_STRIP_ADJACENCY		},
			{ GL_TRIANGLES,				GL_TRIANGLES				},
			{ GL_TRIANGLES,				GL_TRIANGLE_STRIP			},
			{ GL_TRIANGLES,				GL_TRIANGLE_FAN				},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLES_ADJACENCY		},
			{ GL_TRIANGLES_ADJACENCY,	GL_TRIANGLE_STRIP_ADJACENCY	},
		};

		static const GLenum inputTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINES_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLES_ADJACENCY
		};

		static const GLenum primitiveTypes[] =
		{
			GL_POINTS,
			GL_LINES,
			GL_LINE_LOOP,
			GL_LINE_STRIP,
			GL_LINES_ADJACENCY,
			GL_LINE_STRIP_ADJACENCY,
			GL_TRIANGLES,
			GL_TRIANGLE_STRIP,
			GL_TRIANGLE_FAN,
			GL_TRIANGLES_ADJACENCY,
			GL_TRIANGLE_STRIP_ADJACENCY
		};

		for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); ++inputTypeNdx)
		for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
		{
			const GLenum		inputType		= inputTypes[inputTypeNdx];
			const GLenum		primitiveType	= primitiveTypes[primitiveTypeNdx];
			const std::string	name			= std::string("type_") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + "_primitive_" + primitiveTypeToString(primitiveType);
			const std::string	desc			= std::string("Shader input type ") + inputTypeToGLString(sglr::rr_util::mapGLGeometryShaderInputType(inputType)) + ", draw primitive type " + primitiveTypeToString(primitiveType);

			bool isLegal = false;

			for (int legalNdx = 0; legalNdx < DE_LENGTH_OF_ARRAY(legalConversions); ++legalNdx)
				if (legalConversions[legalNdx].inputType == inputType && legalConversions[legalNdx].primitiveType == primitiveType)
					isLegal = true;

			// only illegal
			if (!isLegal)
				negativeGroup->addChild(new NegativeDrawCase(m_context, name.c_str(), desc.c_str(), inputType, primitiveType));
		}
	}

	// vertex transform feedback
	{
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_loop",				"Capture line loop lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_LOOP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_line_strip",				"Capture line strip lines",									VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_LINE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_strip",			"Capture triangle strip triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_STRIP));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_triangle_fan",			"Capture triangle fan triangles",							VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_TRIANGLE_FAN));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays",				"Capture primitives generated with drawArrays",				VertexFeedbackCase::METHOD_DRAW_ARRAYS,				VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_instanced",	"Capture primitives generated with drawArraysInstanced",	VertexFeedbackCase::METHOD_DRAW_ARRAYS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_arrays_indirect",	"Capture primitives generated with drawArraysIndirect",		VertexFeedbackCase::METHOD_DRAW_ARRAYS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements",			"Capture primitives generated with drawElements",			VertexFeedbackCase::METHOD_DRAW_ELEMENTS,			VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_instanced",	"Capture primitives generated with drawElementsInstanced",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INSTANCED,	VertexFeedbackCase::PRIMITIVE_POINTS));
		feedbackGroup->addChild(new VertexFeedbackCase(m_context, "capture_vertex_draw_elements_indirect",	"Capture primitives generated with drawElementsIndirect",	VertexFeedbackCase::METHOD_DRAW_ELEMENTS_INDIRECT,	VertexFeedbackCase::PRIMITIVE_POINTS));

		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_arrays_overflow_single_buffer",		"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ARRAYS));
		feedbackGroup->addChild(new VertexFeedbackOverflowCase(m_context, "capture_vertex_draw_elements_overflow_single_buffer",	"Capture triangles to too small a buffer", VertexFeedbackOverflowCase::METHOD_DRAW_ELEMENTS));
	}
}